

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall
front::syntax::SyntaxAnalyze::gm_func_param
          (SyntaxAnalyze *this,
          vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
          *params,int funcLayerNum,
          vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *genValues)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 uVar3;
  undefined8 this_00;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ArraySymbol *this_01;
  ExpressNode *this_02;
  IntSymbol *pIVar7;
  undefined8 extraout_RAX;
  pointer pWVar8;
  element_type *peVar9;
  element_type *peVar10;
  SharedSyPtr symbol;
  SharedSyPtr genValue;
  SharedExNdPtr holderDimension;
  string name;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  ExpressNode *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  SharedSyPtr local_160;
  SharedSyPtr local_150;
  value_type local_140;
  value_type local_130;
  string local_120;
  undefined1 local_100 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  vector<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>>
  *local_d0;
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  *local_c8;
  SharedSyPtr local_c0;
  string local_b0;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  
  local_180 = &local_170;
  local_178 = 0;
  local_170 = 0;
  local_1b8._M_ptr = (element_type *)0x0;
  local_1b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d0 = (vector<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>>
              *)genValues;
  local_c8 = params;
  match_one_word(this,INTTK);
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_100,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&local_180,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  uVar6 = this->matched_index + 1;
  pWVar8 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar6 < (ulong)(((long)(this->word_list->
                              super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar8 >> 4) *
                      -0x5555555555555555)) &&
     (bVar4 = word::Word::match_token(pWVar8 + uVar6,LBRACK), bVar4)) {
    this_01 = (ArraySymbol *)operator_new(0x78);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_180,local_180 + local_178);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (this_01,&local_120,&local_c0,funcLayerNum + 1,false,true);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>(&local_1b8,this_01);
    if (local_c0.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    match_one_word(this,LBRACK);
    this_02 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_02);
    local_190 = this_02;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
              (&local_188,this_02);
    _Var2._M_pi = local_1b8._M_refcount._M_pi;
    local_190->_type = VAR;
    if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b8._M_refcount._M_pi)->_M_use_count =
             (local_1b8._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b8._M_refcount._M_pi)->_M_use_count =
             (local_1b8._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_130.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_190;
    local_130.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_188._M_pi;
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 *)&local_1b8._M_ptr[1]._name.field_2,&local_130);
    if (local_130.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    match_one_word(this,RBRACK);
    uVar6 = this->matched_index + 1;
    pWVar8 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)(((long)(this->word_list->
                               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar8 >> 4) *
                       -0x5555555555555555)) {
      do {
        bVar4 = word::Word::match_token(pWVar8 + uVar6,LBRACK);
        if (!bVar4) break;
        match_one_word(this,LBRACK);
        gm_exp((SyntaxAnalyze *)local_100);
        this_00 = local_100._8_8_;
        uVar3 = local_100._0_8_;
        match_one_word(this,RBRACK);
        _Var2._M_pi = local_1b8._M_refcount._M_pi;
        if (*(int *)uVar3 != 0) {
          local_1a8._M_ptr = (element_type *)0x0;
          local_1a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pIVar7 = (IntSymbol *)operator_new(0x40);
          hp_gen_save_value_abi_cxx11_(&local_50,this);
          front::symbol::IntSymbol::IntSymbol(pIVar7,&local_50,funcLayerNum + 1,false,0);
          std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
          reset<front::symbol::IntSymbol>(&local_1a8,pIVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::shared_ptr<front::symbol::Symbol>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_100,(shared_ptr<front::symbol::Symbol> *)&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar3 + 0x10));
          std::
          vector<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>
                    (local_d0,(pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._16_8_ != &local_e0) {
            operator_delete((void *)local_100._16_8_,(ulong)(local_e0._M_allocated_capacity + 1));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
          }
          local_150.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_1a8._M_ptr;
          local_150.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_1a8._M_refcount._M_pi;
          if (local_1a8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1a8._M_refcount._M_pi)->_M_use_count =
                   (local_1a8._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1a8._M_refcount._M_pi)->_M_use_count =
                   (local_1a8._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          symbolTable::SymbolTable::push_symbol(&this->symbolTable,&local_150);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_150.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          if (local_150.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_150.
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1a8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8._M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
          }
          if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8._M_refcount._M_pi);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
        if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1b8._M_refcount._M_pi)->_M_use_count =
                 (local_1b8._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1b8._M_refcount._M_pi)->_M_use_count =
                 (local_1b8._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_140.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)uVar3;
        local_140.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
          }
        }
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)&local_1b8._M_ptr[1]._name.field_2,&local_140);
        if (local_140.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_140.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        uVar6 = this->matched_index + 1;
        pWVar8 = (this->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)(((long)(this->word_list->
                                      super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar8 >>
                               4) * -0x5555555555555555));
    }
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
  }
  else {
    pIVar7 = (IntSymbol *)operator_new(0x40);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_180,local_180 + local_178);
    front::symbol::IntSymbol::IntSymbol(pIVar7,&local_b0,funcLayerNum + 1,false,0);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>(&local_1b8,pIVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::push_back(local_c8,(value_type *)&local_1b8);
  local_160.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1b8._M_ptr;
  local_160.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_1b8._M_refcount._M_pi;
  if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b8._M_refcount._M_pi)->_M_use_count = (local_1b8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b8._M_refcount._M_pi)->_M_use_count = (local_1b8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  symbolTable::SymbolTable::push_symbol(&this->symbolTable,&local_160);
  if (local_160.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  iVar5 = (**(local_1b8._M_ptr)->_vptr_Symbol)();
  if (iVar5 == 0) {
    peVar10 = (element_type *)(local_90 + 0x10);
    pcVar1 = ((local_1b8._M_ptr)->_name)._M_dataplus._M_p;
    local_90._0_8_ = peVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + ((local_1b8._M_ptr)->_name)._M_string_length);
    irGenerator::irGenerator::ir_declare_param
              (&this->irGenerator,(string *)local_90,INT,(local_1b8._M_ptr)->id);
    peVar9 = (element_type *)local_90._0_8_;
  }
  else {
    if (iVar5 != 2) goto LAB_001a7b29;
    peVar10 = (element_type *)(local_70 + 0x10);
    pcVar1 = ((local_1b8._M_ptr)->_name)._M_dataplus._M_p;
    local_70._0_8_ = peVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + ((local_1b8._M_ptr)->_name)._M_string_length);
    irGenerator::irGenerator::ir_declare_param
              (&this->irGenerator,(string *)local_70,Ptr,(local_1b8._M_ptr)->id);
    peVar9 = (element_type *)local_70._0_8_;
  }
  if (peVar9 != peVar10) {
    operator_delete(peVar9,(long)peVar10->_vptr_Symbol + 1);
  }
LAB_001a7b29:
  if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_refcount._M_pi);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_func_param(
    vector<SharedSyPtr> &params, int funcLayerNum,
    vector<std::pair<SharedSyPtr, string>> &genValues) {
  string name;
  SharedSyPtr symbol;

  match_one_word(Token::INTTK);
  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 funcLayerNum + 1, false, true));
    match_one_word(Token::LBRACK);

    SharedExNdPtr holderDimension = SharedExNdPtr(new ExpressNode());
    holderDimension->_type = NodeType::VAR;
    std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(
        SharedExNdPtr(holderDimension));

    match_one_word(Token::RBRACK);

    while (try_word(1, Token::LBRACK)) {
      SharedExNdPtr dimension;
      match_one_word(Token::LBRACK);
      dimension = gm_exp();
      match_one_word(Token::RBRACK);
      if (dimension->_type == NodeType::CNS) {
        std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(dimension);
      } else {
        SharedSyPtr genValue;
        SharedExNdPtr genNode;

        genValue.reset(
            new IntSymbol(hp_gen_save_value(), funcLayerNum + 1, false));
        genValues.push_back(
            std::pair<SharedSyPtr, string>(genValue, dimension->_name));
        symbolTable.push_symbol(genValue);

        genNode->_type = NodeType::VAR;
        genNode->_operation = OperationType::ASSIGN;
        genNode->addChild(dimension);
        genNode->_name = genValue->_name;
        std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(genNode);
      }
    }
  } else {
    symbol.reset(new IntSymbol(name, funcLayerNum + 1, false));
  }
  params.push_back(symbol);

  symbolTable.push_symbol(symbol);
  switch (symbol->kind()) {
    case SymbolKind::Array:
      irGenerator.ir_declare_param(symbol->getName(), SymbolKind::Ptr,
                                   symbol->getId());
      break;
    case SymbolKind::INT:
      irGenerator.ir_declare_param(symbol->getName(), SymbolKind::INT,
                                   symbol->getId());
      break;
    default:
      break;
  }
}